

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O2

void __thiscall SAT::cEnqueue(SAT *this,Lit p,Reason r)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  Clause *this_00;
  Lit *pLVar4;
  char cVar5;
  Lit local_1c;
  anon_union_8_2_743a5d44_for_Reason_0 local_18;
  
  uVar3 = p.x >> 1;
  pcVar2 = (this->assigns).data;
  cVar1 = pcVar2[uVar3];
  cVar5 = -cVar1;
  if ((p.x & 1U) == 0) {
    cVar5 = cVar1;
  }
  local_1c.x = p.x;
  local_18 = r.field_0;
  if (cVar5 == ::l_False.value) {
    if ((!so.lazy) || (r.field_0 == (Clause *)0x0)) {
      setConfl(this,::lit_False,::lit_False);
      return;
    }
    this_00 = getConfl(this,(Reason *)&local_18,p);
    this->confl = this_00;
    pLVar4 = Clause::operator[](this_00,0);
    pLVar4->x = p.x;
  }
  else {
    pcVar2[uVar3] = -((byte)p.x & 1) | 1;
    (this->trailpos).data[uVar3] = engine.trail.sz;
    (this->reason).data[uVar3].field_0 = r.field_0;
    vec<Lit>::push((this->trail).data + ((this->trail).sz - 1),&local_1c);
  }
  return;
}

Assistant:

void SAT::cEnqueue(Lit p, Reason r) {
	/* if (so.debug) { */
	/*   std::cerr << "c-enqueue literal " << getLitString(toInt(p)) << " because " << showReason(r)
	 * << "\n"; */
	/* } */
	assert(value(p) != l_True);
	const int v = var(p);
	if (value(p) == l_False) {
		if (so.lazy) {
			if (r == nullptr) {
				assert(decisionLevel() == 0);
				setConfl();
			} else {
				confl = getConfl(r, p);
				(*confl)[0] = p;
			}
		} else {
			setConfl();
		}
		return;
	}
	assigns[v] = toInt(lbool(!sign(p)));
	trailpos[v] = engine.trailPos();
	reason[v] = r;
	trail.last().push(p);
}